

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertDirectorySeparatorsForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view source)

{
  undefined1 uVar1;
  bool bVar2;
  cmState *pcVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  char local_52 [2];
  char *local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  allocator<char> local_2a;
  undefined1 local_29;
  cmOutputConverter *local_28;
  cmOutputConverter *this_local;
  string_view source_local;
  string *result;
  
  source_local._M_len = (size_t)source._M_str;
  this_local = (cmOutputConverter *)source._M_len;
  local_29 = 0;
  local_28 = this;
  source_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  pcVar3 = GetState(this);
  bVar2 = cmState::UseMSYSShell(pcVar3);
  if ((((bVar2) && ((this->LinkScriptShell & 1U) == 0)) &&
      (uVar4 = std::__cxx11::string::size(), 2 < uVar4)) &&
     (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
     *pcVar5 == ':')) {
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    uVar1 = *puVar6;
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar6 = uVar1;
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar6 = 0x2f;
  }
  pcVar3 = GetState(this);
  bVar2 = cmState::UseWindowsShell(pcVar3);
  if (bVar2) {
    local_48._M_current = (char *)std::__cxx11::string::begin();
    local_50 = (char *)std::__cxx11::string::end();
    local_52[1] = 0x2f;
    local_52[0] = '\\';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_48,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_50,local_52 + 1,local_52);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertDirectorySeparatorsForShell(
  cm::string_view source) const
{
  std::string result(source);
  // For the MSYS shell convert drive letters to posix paths, so
  // that c:/some/path becomes /c/some/path.  This is needed to
  // avoid problems with the shell path translation.
  if (this->GetState()->UseMSYSShell() && !this->LinkScriptShell) {
    if (result.size() > 2 && result[1] == ':') {
      result[1] = result[0];
      result[0] = '/';
    }
  }
  if (this->GetState()->UseWindowsShell()) {
    std::replace(result.begin(), result.end(), '/', '\\');
  }
  return result;
}